

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engine.c
# Opt level: O0

void engine(qcc_context *_ctx)

{
  qcc_arena *arena_00;
  qcc_uint exp_val_5;
  qcc_uint got_val_5;
  qcc_uint exp_val_4;
  qcc_uint got_val_4;
  qcc_uint exp_val_3;
  qcc_uint got_val_3;
  qcc_uint exp_val_2;
  qcc_uint got_val_2;
  qcc_uint exp_val_1;
  qcc_uint got_val_1;
  qcc_uint exp_val;
  qcc_uint got_val;
  qcc_engine engine;
  size_t arena_size;
  qcc_arena *arena;
  qcc_context *_ctx_local;
  
  arena_00 = qcc_rand_arena(_ctx);
  engine.logger.messages.last = (qcc_log_message *)qcc_arena_memory_available(arena_00);
  qcc_context_register_param(_ctx,"%s: qcc_arena %zu bytes","arena",engine.logger.messages.last);
  qcc_engine_init((qcc_engine *)&got_val,arena_00);
  if ((ulong)engine.max_tries == 0) {
    if ((ulong)engine.required_successes == 0) {
      qcc_engine_run_test((qcc_engine *)&got_val,"test_success",test_success);
      if ((ulong)engine.max_tries == 1) {
        if ((ulong)engine.required_successes == 0) {
          qcc_engine_run_test((qcc_engine *)&got_val,"test_failure",test_failure);
          if ((ulong)engine.max_tries == 2) {
            if ((ulong)engine.required_successes != 1) {
              qcc_context_fail(_ctx,
                               "Assertion \"%s %s %s\" (%lu %s %lu) failed in %s (%s, line %d)\n",
                               "engine.failed_tests","==","1",(ulong)engine.required_successes,"==",
                               1,"engine",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/test/test_engine.c"
                               ,0x1b);
            }
          }
          else {
            qcc_context_fail(_ctx,"Assertion \"%s %s %s\" (%lu %s %lu) failed in %s (%s, line %d)\n"
                             ,"engine.total_tests","==","2",(ulong)engine.max_tries,"==",2,"engine",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/test/test_engine.c"
                             ,0x1a);
          }
        }
        else {
          qcc_context_fail(_ctx,"Assertion \"%s %s %s\" (%lu %s %lu) failed in %s (%s, line %d)\n",
                           "engine.failed_tests","==","0",(ulong)engine.required_successes,"==",0,
                           "engine",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/test/test_engine.c"
                           ,0x17);
        }
      }
      else {
        qcc_context_fail(_ctx,"Assertion \"%s %s %s\" (%lu %s %lu) failed in %s (%s, line %d)\n",
                         "engine.total_tests","==","1",(ulong)engine.max_tries,"==",1,"engine",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/test/test_engine.c"
                         ,0x16);
      }
    }
    else {
      qcc_context_fail(_ctx,"Assertion \"%s %s %s\" (%lu %s %lu) failed in %s (%s, line %d)\n",
                       "engine.failed_tests","==","0",(ulong)engine.required_successes,"==",0,
                       "engine",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/test/test_engine.c"
                       ,0x13);
    }
  }
  else {
    qcc_context_fail(_ctx,"Assertion \"%s %s %s\" (%lu %s %lu) failed in %s (%s, line %d)\n",
                     "engine.total_tests","==","0",(ulong)engine.max_tries,"==",0,"engine",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/test/test_engine.c"
                     ,0x12);
  }
  return;
}

Assistant:

TEST(engine)
{
    GIVEN_ARENA(arena);

    struct qcc_engine engine;
    qcc_engine_init(&engine, arena);
    ASSERT_UNSIGNED(engine.total_tests, ==, 0);
    ASSERT_UNSIGNED(engine.failed_tests, ==, 0);

    qcc_engine_run_test(&engine, "test_success", &test_success);
    ASSERT_UNSIGNED(engine.total_tests, ==, 1);
    ASSERT_UNSIGNED(engine.failed_tests, ==, 0);

    qcc_engine_run_test(&engine, "test_failure", &test_failure);
    ASSERT_UNSIGNED(engine.total_tests, ==, 2);
    ASSERT_UNSIGNED(engine.failed_tests, ==, 1);
}